

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_85(QPDF *pdf,char *arg2)

{
  char cVar1;
  bool b;
  uint ui;
  int i;
  string s;
  double num;
  unsigned_long_long uli;
  longlong li;
  QPDFObjectHandle oh_r;
  QPDFObjectHandle oh_i;
  QPDFObjectHandle oh_b;
  QPDFObjectHandle oh_s;
  QPDFObjectHandle oh_ii;
  QPDFObjectHandle oh_o;
  QPDFObjectHandle oh_n;
  QPDFObjectHandle oh_i_neg;
  QPDFObjectHandle oh_i_minminus;
  QPDFObjectHandle oh_i_umaxplus;
  QPDFObjectHandle oh_i_maxplus;
  
  QPDFObjectHandle::newBool(SUB81(&oh_b,0));
  QPDFObjectHandle::newInteger((longlong)&oh_i);
  QPDFObjectHandle::newInteger((longlong)&oh_i_maxplus);
  QPDFObjectHandle::newInteger((longlong)&oh_i_umaxplus);
  QPDFObjectHandle::newInteger((longlong)&oh_i_minminus);
  QPDFObjectHandle::newInteger((longlong)&oh_i_neg);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s,"42.0",(allocator<char> *)&oh_n);
  QPDFObjectHandle::newReal((string *)&oh_r);
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s,"/Test",(allocator<char> *)&oh_s);
  QPDFObjectHandle::newName((string *)&oh_n);
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s,"/Test",(allocator<char> *)&oh_o);
  QPDFObjectHandle::newString((string *)&oh_s);
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s,"/Test",(allocator<char> *)&oh_ii)
  ;
  QPDFObjectHandle::newOperator((string *)&oh_o);
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s,"/Test",(allocator<char> *)&li);
  QPDFObjectHandle::newInlineImage((string *)&oh_ii);
  std::__cxx11::string::~string((string *)&s);
  cVar1 = QPDFObjectHandle::getValueAsBool((bool *)&oh_b);
  if (cVar1 != '\0') {
    __assert_fail("!b",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xbc3,"void test_85(QPDF &, const char *)");
  }
  __assert_fail("oh_b.getValueAsBool(b)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0xbc2,"void test_85(QPDF &, const char *)");
}

Assistant:

static void
test_85(QPDF& pdf, char const* arg2)
{
    // Test QPDFObjectHandle::getValueAs... accessors

    auto oh_b = QPDFObjectHandle::newBool(false);
    auto oh_i = QPDFObjectHandle::newInteger(1);
    auto oh_i_maxplus = QPDFObjectHandle::newInteger(QIntC::to_longlong(INT_MAX) + 1LL);
    auto oh_i_umaxplus = QPDFObjectHandle::newInteger(QIntC::to_longlong(UINT_MAX) + 1LL);
    auto oh_i_minminus = QPDFObjectHandle::newInteger(QIntC::to_longlong(INT_MIN) - 1LL);
    auto oh_i_neg = QPDFObjectHandle::newInteger(-1);
    auto oh_r = QPDFObjectHandle::newReal("42.0");
    auto oh_n = QPDFObjectHandle::newName("/Test");
    auto oh_s = QPDFObjectHandle::newString("/Test");
    auto oh_o = QPDFObjectHandle::newOperator("/Test");
    auto oh_ii = QPDFObjectHandle::newInlineImage("/Test");

    bool b = true;
    assert(oh_b.getValueAsBool(b));
    assert(!b);
    assert(!oh_i.getValueAsBool(b));
    assert(!b);
    long long li = 0LL;
    assert(oh_i.getValueAsInt(li));
    assert(li == 1LL);
    assert(!oh_b.getValueAsInt(li));
    assert(li == 1LL);
    int i = 0;
    assert(oh_i.getValueAsInt(i));
    assert(i == 1);
    assert(!oh_b.getValueAsInt(i));
    assert(i == 1);
    assert(oh_i_maxplus.getValueAsInt(i));
    assert(i == INT_MAX);
    assert(oh_i_minminus.getValueAsInt(i));
    assert(i == INT_MIN);
    unsigned long long uli = 0U;
    assert(oh_i.getValueAsUInt(uli));
    assert(uli == 1u);
    assert(!oh_b.getValueAsUInt(uli));
    assert(uli == 1u);
    assert(oh_i_neg.getValueAsUInt(uli));
    assert(uli == 0u);
    unsigned int ui = 0U;
    assert(oh_i.getValueAsUInt(ui));
    assert(ui == 1u);
    assert(!oh_b.getValueAsUInt(ui));
    assert(ui == 1u);
    assert(oh_i_neg.getValueAsUInt(ui));
    assert(ui == 0u);
    assert(oh_i_umaxplus.getValueAsUInt(ui));
    assert(ui == UINT_MAX);
    std::string s = "0";
    assert(oh_r.getValueAsReal(s));
    assert(s == "42.0");
    assert(!oh_i.getValueAsReal(s));
    assert(s == "42.0");
    double num = 0.0;
    assert(oh_i.getValueAsNumber(num));
    assert(((num - 1.0) < 1e-6) && (num - 1.0 > -1e-6));
    assert(oh_r.getValueAsNumber(num));
    assert(((num - 42.0) < 1e-6) && (num - 42.0 > -1e-6));
    assert(!oh_b.getValueAsNumber(num));
    assert(((num - 42.0) < 1e-6) && (num - 42.0 > -1e-6));
    s = "";
    assert(oh_n.getValueAsName(s));
    assert(s == "/Test");
    assert(!oh_r.getValueAsName(s));
    assert(s == "/Test");
    s = "";
    assert(oh_s.getValueAsUTF8(s));
    assert(s == "/Test");
    assert(!oh_r.getValueAsUTF8(s));
    assert(s == "/Test");
    s = "";
    assert(oh_s.getValueAsUTF8(s));
    assert(s == "/Test");
    assert(!oh_r.getValueAsUTF8(s));
    assert(s == "/Test");
    s = "";
    assert(oh_o.getValueAsOperator(s));
    assert(s == "/Test");
    assert(!oh_r.getValueAsOperator(s));
    assert(s == "/Test");
    s = "";
    assert(oh_ii.getValueAsInlineImage(s));
    assert(s == "/Test");
    assert(!oh_r.getValueAsInlineImage(s));
    assert(s == "/Test");
}